

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimulationIslandManager.cpp
# Opt level: O2

void __thiscall
btSimulationIslandManager::storeIslandActivationState
          (btSimulationIslandManager *this,btCollisionWorld *colWorld)

{
  btCollisionObject *pbVar1;
  int iVar2;
  int iVar3;
  int x;
  int i;
  long lVar4;
  
  x = 0;
  for (lVar4 = 0; lVar4 < (colWorld->m_collisionObjects).m_size; lVar4 = lVar4 + 1) {
    pbVar1 = (colWorld->m_collisionObjects).m_data[lVar4];
    iVar3 = -1;
    if ((pbVar1->m_collisionFlags & 3) == 0) {
      iVar2 = btUnionFind::find(&this->m_unionFind,x);
      (this->m_unionFind).m_elements.m_data[x].m_sz = (int)lVar4;
      x = x + 1;
    }
    else {
      iVar2 = iVar3;
      iVar3 = -2;
    }
    pbVar1->m_islandTag1 = iVar2;
    pbVar1->m_companionId = iVar3;
  }
  return;
}

Assistant:

void   btSimulationIslandManager::storeIslandActivationState(btCollisionWorld* colWorld)
{
	// put the islandId ('find' value) into m_tag   
	{
		int index = 0;
		int i;
		for (i=0;i<colWorld->getCollisionObjectArray().size();i++)
		{
			btCollisionObject* collisionObject= colWorld->getCollisionObjectArray()[i];
			if (!collisionObject->isStaticOrKinematicObject())
			{
				collisionObject->setIslandTag( m_unionFind.find(index) );
				//Set the correct object offset in Collision Object Array
				m_unionFind.getElement(index).m_sz = i;
				collisionObject->setCompanionId(-1);
				index++;
			} else
			{
				collisionObject->setIslandTag(-1);
				collisionObject->setCompanionId(-2);
			}
		}
	}
}